

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> * __thiscall
libtorrent::torrent_info::similar_torrents
          (vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           *__return_storage_ptr__,torrent_info *this)

{
  int *piVar1;
  pointer pdVar2;
  int *st;
  int *piVar3;
  digest32<160L> *st_1;
  pointer __x;
  char *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start >> 2) +
             ((long)(this->m_owned_similar_torrents).
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_owned_similar_torrents).
                   super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x14);
  piVar1 = (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar3 = (this->m_similar_torrents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    local_30 = (this->m_info_section).px + *piVar3;
    ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
    emplace_back<char*>((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                         *)__return_storage_ptr__,&local_30);
  }
  pdVar2 = (this->m_owned_similar_torrents).
           super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->m_owned_similar_torrents).
             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pdVar2; __x = __x + 1) {
    ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
    push_back(__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sha1_hash> torrent_info::similar_torrents() const
	{
		std::vector<sha1_hash> ret;
#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		ret.reserve(m_similar_torrents.size() + m_owned_similar_torrents.size());

		for (auto const& st : m_similar_torrents)
			ret.emplace_back(m_info_section.get() + st);

		for (auto const& st : m_owned_similar_torrents)
			ret.push_back(st);
#endif

		return ret;
	}